

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O1

bool __thiscall
testing::internal::OnCallSpec<test_result_(bool)>::Matches
          (OnCallSpec<test_result_(bool)> *this,ArgumentTuple *args)

{
  MatcherInterface<bool> *pMVar1;
  MatcherInterface<const_std::tr1::tuple<bool,_void,_void,_void,_void,_void,_void,_void,_void,_void>_&>
  *pMVar2;
  undefined1 uVar3;
  int iVar4;
  DummyMatchResultListener dummy;
  
  pMVar1 = (this->matchers_).f0_.super_MatcherBase<bool>.impl_.value_;
  iVar4 = (*(pMVar1->super_MatcherDescriberInterface)._vptr_MatcherDescriberInterface[4])
                    (pMVar1,(ulong)args->f0_);
  if ((char)iVar4 == '\0') {
    uVar3 = 0;
  }
  else {
    pMVar2 = (this->extra_matcher_).
             super_MatcherBase<const_std::tr1::tuple<bool,_void,_void,_void,_void,_void,_void,_void,_void,_void>_&>
             .impl_.value_;
    iVar4 = (*(pMVar2->super_MatcherDescriberInterface)._vptr_MatcherDescriberInterface[4])
                      (pMVar2,args);
    uVar3 = (undefined1)iVar4;
  }
  return (bool)uVar3;
}

Assistant:

bool Matches(const ArgumentTuple& args) const {
    return TupleMatches(matchers_, args) && extra_matcher_.Matches(args);
  }